

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  _Setprecision _Var1;
  ostream *poVar2;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  lbegin;
  type x_00;
  longlong lVar3;
  void *pvVar4;
  size_t sVar5;
  iterator pvVar6;
  iterator pvVar7;
  size_type sVar8;
  ostream *this;
  int in_EDI;
  float fVar9;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar10 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  exception *e;
  value_type_conflict *time_1;
  iterator __end1;
  iterator __begin1;
  array<float,_100UL> *__range1;
  array<float,_100UL> times;
  vector<dlib::sgd,_std::allocator<dlib::sgd>_> solvers;
  train_50 net;
  vector<unsigned_long,_std::allocator<unsigned_long>_> labels;
  value_type_conflict *time;
  iterator __end2;
  iterator __begin2;
  array<float,_100UL> *__range2;
  array<float,_100UL> times_1;
  infer_50 net_1;
  resizable_tensor x;
  vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
  minibatch;
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  image;
  size_t image_size;
  size_t mini_batch_size;
  float duration;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  t1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  t0;
  float in_stack_ffffffffffffee38;
  float in_stack_ffffffffffffee3c;
  add_loss_layer<_f418249_> *in_stack_ffffffffffffee40;
  resizable_tensor *in_stack_ffffffffffffee48;
  add_loss_layer<_f418249_> *in_stack_ffffffffffffee50;
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  in_stack_ffffffffffffee58;
  __normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
  in_stack_ffffffffffffee60;
  allocator<char> *in_stack_ffffffffffffee70;
  undefined4 in_stack_ffffffffffffee78;
  undefined4 in_stack_ffffffffffffee7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee80;
  add_loss_layer<_f418249_> *this_00;
  duration<float,_std::ratio<1L,_1000L>_> local_f7c;
  _func_type_index *local_f78;
  unsigned_long *local_f70;
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *local_f68;
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *local_f60;
  longlong local_f58;
  value_type_conflict *local_f50;
  value_type_conflict *local_f48;
  value_type_conflict *local_f40;
  array<float,_100UL> *local_f38;
  array<float,_100UL> local_f30;
  unsigned_long *local_da0;
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *local_d98;
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *local_d90;
  undefined8 local_848;
  int local_824;
  rep local_820;
  duration<float,_std::ratio<1L,_1000L>_> local_814;
  _func_type_index *local_810;
  longlong local_808;
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *local_800;
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *local_7f8;
  iterator local_7f0;
  iterator local_7e8;
  iterator local_7e0;
  array<float,_100UL> *local_7d8;
  array<float,_100UL> local_7d0;
  rep local_640;
  duration<float,_std::ratio<1L,_1000L>_> local_634;
  _func_type_index *local_630;
  longlong local_628;
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *local_620;
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *local_618;
  rep local_610;
  duration<float,_std::ratio<1L,_1000L>_> local_604;
  _func_type_index *local_600;
  longlong local_180;
  tensor local_178 [3];
  undefined1 local_d8 [71];
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [32];
  void *local_48;
  _func_void_void_ptr *local_40;
  float local_34;
  _func_type_index *local_30;
  longlong local_18;
  int local_8;
  int local_4;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  
  local_4 = 0;
  local_8 = in_EDI;
  setenv("CUDA_LAUNCH_BLOCKING","1",1);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffee40);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffee40);
  local_34 = 0.0;
  local_40 = (_func_void_void_ptr *)0x1;
  local_48 = (void *)0xe0;
  if (1 < local_8) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffee80,
               (char *)CONCAT44(in_stack_ffffffffffffee7c,in_stack_ffffffffffffee78),
               in_stack_ffffffffffffee70);
    local_40 = (_func_void_void_ptr *)
               std::__cxx11::stoul((string *)in_stack_ffffffffffffee40,
                                   (size_t *)
                                   CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38),0);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  if (2 < local_8) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffee80,
               (char *)CONCAT44(in_stack_ffffffffffffee7c,in_stack_ffffffffffffee78),
               in_stack_ffffffffffffee70);
    local_48 = (void *)std::__cxx11::stoul((string *)in_stack_ffffffffffffee40,
                                           (size_t *)
                                           CONCAT44(in_stack_ffffffffffffee3c,
                                                    in_stack_ffffffffffffee38),0);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  dlib::
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  ::matrix(in_stack_ffffffffffffee60._M_current,(long)in_stack_ffffffffffffee58._M_current,
           (long)in_stack_ffffffffffffee50);
  dlib::rgb_pixel::rgb_pixel((rgb_pixel *)(local_d8 + 0x1d),'\0','\0','\0');
  dlib::
  assign_all_pixels<dlib::matrix<dlib::rgb_pixel,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::rgb_pixel>
            (in_stack_ffffffffffffee60._M_current,(rgb_pixel *)in_stack_ffffffffffffee58._M_current)
  ;
  std::
  allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
  ::allocator((allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
               *)0x106ca6);
  std::
  vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
  ::vector((vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
            *)in_stack_ffffffffffffee60._M_current,(size_type)in_stack_ffffffffffffee58._M_current,
           (value_type *)in_stack_ffffffffffffee50,(allocator_type *)in_stack_ffffffffffffee48);
  std::
  allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
  ::~allocator((allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
                *)0x106cda);
  dlib::resizable_tensor::resizable_tensor((resizable_tensor *)in_stack_ffffffffffffee50);
  local_180 = std::chrono::_V2::steady_clock::now();
  local_18 = local_180;
  dlib::add_loss_layer<$e8a4ea05$>::add_loss_layer
            ((add_loss_layer<_e8a4ea05_> *)in_stack_ffffffffffffee50);
  local_600 = (_func_type_index *)std::chrono::_V2::steady_clock::now();
  local_30 = local_600;
  local_610 = (rep)std::chrono::operator-
                             ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_ffffffffffffee48,
                              (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_ffffffffffffee40);
  local_604.__r =
       (rep_conflict)
       std::chrono::
       duration_cast<std::chrono::duration<float,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                 ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                  CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
  local_34 = std::chrono::duration<float,_std::ratio<1L,_1000L>_>::count(&local_604);
  poVar2 = std::operator<<((ostream *)&std::cout,"instantiation time: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_34);
  lbegin._M_current = (unsigned_long *)std::operator<<(poVar2," ms");
  std::ostream::operator<<(lbegin._M_current,std::endl<char,std::char_traits<char>>);
  std::istream::get();
  this_00 = (add_loss_layer<_f418249_> *)local_d8;
  local_618 = (matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
               *)std::
                 vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                 ::begin((vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                          *)CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
  local_620 = (matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
               *)std::
                 vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                 ::end((vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                        *)CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
  dlib::add_loss_layer<$e8a4ea05$>::
  to_tensor<__gnu_cxx::__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
            ((add_loss_layer<_e8a4ea05_> *)in_stack_ffffffffffffee50,in_stack_ffffffffffffee60,
             in_stack_ffffffffffffee58,in_stack_ffffffffffffee48);
  local_628 = std::chrono::_V2::steady_clock::now();
  local_18 = local_628;
  dlib::add_loss_layer<$e8a4ea05$>::forward
            ((add_loss_layer<_e8a4ea05_> *)in_stack_ffffffffffffee40,
             (tensor *)CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
  local_630 = (_func_type_index *)std::chrono::_V2::steady_clock::now();
  local_30 = local_630;
  x_00 = std::chrono::operator-
                   ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_ffffffffffffee48,
                    (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_ffffffffffffee40);
  local_640 = x_00.__r;
  local_634.__r =
       (rep_conflict)
       std::chrono::
       duration_cast<std::chrono::duration<float,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                 ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                  CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
  local_34 = std::chrono::duration<float,_std::ratio<1L,_1000L>_>::count(&local_634);
  poVar2 = std::operator<<((ostream *)&std::cout,"1st inference time: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_34);
  poVar2 = std::operator<<(poVar2," ms");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"input shape: ");
  lVar3 = dlib::tensor::num_samples(local_178);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar3);
  poVar2 = std::operator<<(poVar2,'x');
  lVar3 = dlib::tensor::k(local_178);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar3);
  poVar2 = std::operator<<(poVar2,'x');
  lVar3 = dlib::tensor::nr(local_178);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar3);
  poVar2 = std::operator<<(poVar2,'x');
  lVar3 = dlib::tensor::nc(local_178);
  pvVar4 = (void *)std::ostream::operator<<(poVar2,lVar3);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"parameters: ");
  sVar5 = dlib::count_parameters<_4f6b03b7_>
                    ((add_loss_layer<_e8a4ea05_> *)in_stack_ffffffffffffee40);
  pvVar4 = (void *)std::ostream::operator<<(poVar2,sVar5);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::istream::get();
  local_7d8 = &local_7d0;
  local_7e0 = std::array<float,_100UL>::begin((array<float,_100UL> *)0x1071c5);
  local_7e8 = std::array<float,_100UL>::end((array<float,_100UL> *)0x1071da);
  for (; local_7e0 != local_7e8; local_7e0 = local_7e0 + 1) {
    local_7f0 = local_7e0;
    local_7f8 = (matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                 *)std::
                   vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                   ::begin((vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                            *)CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
    local_800 = (matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                 *)std::
                   vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                   ::end((vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                          *)CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
    dlib::add_loss_layer<$e8a4ea05$>::
    to_tensor<__gnu_cxx::__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
              ((add_loss_layer<_e8a4ea05_> *)in_stack_ffffffffffffee50,in_stack_ffffffffffffee60,
               in_stack_ffffffffffffee58,in_stack_ffffffffffffee48);
    local_808 = std::chrono::_V2::steady_clock::now();
    local_18 = local_808;
    dlib::add_loss_layer<$e8a4ea05$>::forward
              ((add_loss_layer<_e8a4ea05_> *)in_stack_ffffffffffffee40,
               (tensor *)CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
    local_810 = (_func_type_index *)std::chrono::_V2::steady_clock::now();
    local_30 = local_810;
    local_820 = (rep)std::chrono::operator-
                               ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)in_stack_ffffffffffffee48,
                                (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)in_stack_ffffffffffffee40);
    local_814.__r =
         (rep_conflict)
         std::chrono::
         duration_cast<std::chrono::duration<float,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                   ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                    CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
    local_34 = std::chrono::duration<float,_std::ratio<1L,_1000L>_>::count(&local_814);
    poVar2 = std::operator<<((ostream *)&std::cout,"2nd inference time: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_34);
    poVar2 = std::operator<<(poVar2," ms   \r");
    std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
    *local_7f0 = local_34;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"\navg: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::fixed);
  auVar11._8_56_ = extraout_var;
  auVar11._0_8_ = extraout_XMM1_Qa;
  auVar10 = auVar11._0_16_;
  local_824 = (int)std::setprecision(3);
  poVar2 = std::operator<<(poVar2,(_Setprecision)local_824);
  pvVar6 = std::array<float,_100UL>::begin((array<float,_100UL> *)0x1074fa);
  pvVar7 = std::array<float,_100UL>::end((array<float,_100UL> *)0x10750f);
  fVar9 = std::accumulate<float*,float,std::plus<float>>(0,pvVar6,pvVar7);
  sVar8 = std::array<float,_100UL>::size(&local_7d0);
  auVar10 = vcvtusi2ss_avx512f(auVar10,sVar8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar9 / auVar10._0_4_);
  poVar2 = std::operator<<(poVar2," ms");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::istream::get();
  dlib::add_loss_layer<$e8a4ea05$>::clean((add_loss_layer<_e8a4ea05_> *)in_stack_ffffffffffffee40);
  dlib::add_loss_layer<$e8a4ea05$>::~add_loss_layer
            ((add_loss_layer<_e8a4ea05_> *)in_stack_ffffffffffffee40);
  local_848 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1075f4);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_ffffffffffffee60._M_current,(size_type)in_stack_ffffffffffffee58._M_current,
             (value_type_conflict2 *)in_stack_ffffffffffffee50,
             (allocator_type *)in_stack_ffffffffffffee48);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x107628);
  dlib::add_loss_layer<$f418249$>::add_loss_layer(in_stack_ffffffffffffee50);
  dlib::sgd::sgd((sgd *)in_stack_ffffffffffffee40,in_stack_ffffffffffffee3c,
                 in_stack_ffffffffffffee38);
  std::allocator<dlib::sgd>::allocator((allocator<dlib::sgd> *)0x10766b);
  std::vector<dlib::sgd,_std::allocator<dlib::sgd>_>::vector
            ((vector<dlib::sgd,_std::allocator<dlib::sgd>_> *)in_stack_ffffffffffffee60._M_current,
             (size_type)in_stack_ffffffffffffee58._M_current,(value_type *)in_stack_ffffffffffffee50
             ,(allocator_type *)in_stack_ffffffffffffee48);
  std::allocator<dlib::sgd>::~allocator((allocator<dlib::sgd> *)0x10769c);
  dlib::sgd::~sgd((sgd *)0x1076a9);
  local_d90 = (matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
               *)std::
                 vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                 ::begin((vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                          *)CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
  local_d98 = (matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
               *)std::
                 vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                 ::end((vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                        *)CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
  dlib::add_loss_layer<$f418249$>::
  to_tensor<__gnu_cxx::__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
             in_stack_ffffffffffffee48);
  local_da0 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
  dlib::add_loss_layer<$f418249$>::
  compute_loss<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            (this_00,(tensor *)x_00.__r,lbegin);
  dlib::add_loss_layer<$f418249$>::back_propagate_error
            (in_stack_ffffffffffffee40,
             (tensor *)CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38),no);
  dlib::add_loss_layer<$f418249$>::update_parameters<dlib::sgd>
            ((add_loss_layer<_f418249_> *)in_stack_ffffffffffffee60._M_current,
             (vector<dlib::sgd,_std::allocator<dlib::sgd>_> *)in_stack_ffffffffffffee58._M_current,
             (double)in_stack_ffffffffffffee50);
  local_f38 = &local_f30;
  local_f40 = std::array<float,_100UL>::begin((array<float,_100UL> *)0x10778e);
  local_f48 = std::array<float,_100UL>::end((array<float,_100UL> *)0x1077a3);
  for (; local_f40 != local_f48; local_f40 = local_f40 + 1) {
    local_f50 = local_f40;
    local_f58 = std::chrono::_V2::steady_clock::now();
    local_18 = local_f58;
    local_f60 = (matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                 *)std::
                   vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                   ::begin((vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                            *)CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
    local_f68 = (matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                 *)std::
                   vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                   ::end((vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
                          *)CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
    dlib::add_loss_layer<$f418249$>::
    to_tensor<__gnu_cxx::__normal_iterator<const_dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_*,_std::vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
              (in_stack_ffffffffffffee50,in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
               in_stack_ffffffffffffee48);
    local_f70 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
    dlib::add_loss_layer<$f418249$>::
    compute_loss<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              (this_00,(tensor *)x_00.__r,lbegin);
    dlib::add_loss_layer<$f418249$>::back_propagate_error
              (in_stack_ffffffffffffee40,
               (tensor *)CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38),no);
    dlib::add_loss_layer<$f418249$>::update_parameters<dlib::sgd>
              ((add_loss_layer<_f418249_> *)in_stack_ffffffffffffee60._M_current,
               (vector<dlib::sgd,_std::allocator<dlib::sgd>_> *)in_stack_ffffffffffffee58._M_current
               ,(double)in_stack_ffffffffffffee50);
    local_f78 = (_func_type_index *)std::chrono::_V2::steady_clock::now();
    local_30 = local_f78;
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffee48,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffee40);
    local_f7c.__r =
         (rep_conflict)
         std::chrono::
         duration_cast<std::chrono::duration<float,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                   ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                    CONCAT44(in_stack_ffffffffffffee3c,in_stack_ffffffffffffee38));
    local_34 = std::chrono::duration<float,_std::ratio<1L,_1000L>_>::count(&local_f7c);
    poVar2 = std::operator<<((ostream *)&std::cout,"backward pass time: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_34);
    poVar2 = std::operator<<(poVar2," ms   \r");
    std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
    *local_f50 = local_34;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"\navg: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::fixed);
  auVar12._8_56_ = extraout_var_00;
  auVar12._0_8_ = extraout_XMM1_Qa_00;
  auVar10 = auVar12._0_16_;
  _Var1 = std::setprecision(3);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar6 = std::array<float,_100UL>::begin((array<float,_100UL> *)0x107af9);
  pvVar7 = std::array<float,_100UL>::end((array<float,_100UL> *)0x107b08);
  fVar9 = std::accumulate<float*,float,std::plus<float>>(0,pvVar6,pvVar7);
  sVar8 = std::array<float,_100UL>::size(&local_f30);
  auVar10 = vcvtusi2ss_avx512f(auVar10,sVar8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar9 / auVar10._0_4_);
  this = std::operator<<(poVar2," ms");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::istream::get();
  local_4 = 0;
  std::vector<dlib::sgd,_std::allocator<dlib::sgd>_>::~vector
            ((vector<dlib::sgd,_std::allocator<dlib::sgd>_> *)poVar2);
  dlib::add_loss_layer<$f418249$>::~add_loss_layer(in_stack_ffffffffffffee40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)poVar2);
  dlib::resizable_tensor::~resizable_tensor((resizable_tensor *)in_stack_ffffffffffffee40);
  std::
  vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
  ::~vector((vector<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_std::allocator<dlib::matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
             *)poVar2);
  dlib::
  matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  ::~matrix((matrix<dlib::rgb_pixel,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
             *)0x107be1);
  return local_4;
}

Assistant:

int main(const int argc, const char** argv)try
{
    setenv("CUDA_LAUNCH_BLOCKING", "1", 1);
    chrono::time_point<chrono::steady_clock> t0, t1;
    float duration{};

    size_t mini_batch_size = 1;
    size_t image_size = 224;
    if (argc > 1)
    {
        mini_batch_size = std::stoul(argv[1]);
    }
    if (argc > 2)
    {
        image_size = std::stoul(argv[2]);
    }

    // Create the images to test
    dlib::matrix<dlib::rgb_pixel> image(image_size, image_size);
    dlib::assign_all_pixels(image, dlib::rgb_pixel(0, 0, 0));
    const std::vector<dlib::matrix<dlib::rgb_pixel>> minibatch(mini_batch_size, image);

    // The input tensor of the network
    dlib::resizable_tensor x;

    {
        // Declare the network
        t0 = chrono::steady_clock::now();
        resnet::infer_50 net;
        t1 = chrono::steady_clock::now();
        duration = chrono::duration_cast<fms>(t1 - t0).count();
        std::cout << "instantiation time: " << duration << " ms" << std::endl;
        std::cin.get();

        // Convert them to a tensor for this network. This way we only measure inference and not
        // data transfer. In PyTorch, this would be: x = x.cuda()
        net.to_tensor(minibatch.begin(), minibatch.end(), x);
        t0 = chrono::steady_clock::now();
        net.forward(x);
        t1 = chrono::steady_clock::now();
        duration = chrono::duration_cast<fms>(t1 - t0).count();
        std::cout << "1st inference time: " << duration << " ms" << std::endl;
        std::cout << "input shape: " << x.num_samples() << 'x' << x.k() << 'x' << x.nr() << 'x'
                  << x.nc() << std::endl;
        std::cout << "parameters: " << dlib::count_parameters(net) << std::endl;
        std::cin.get();

        std::array<float, 100> times;
        for (auto& time : times)
        {
            net.to_tensor(minibatch.begin(), minibatch.end(), x);
            t0 = chrono::steady_clock::now();
            net.forward(x);
            t1 = chrono::steady_clock::now();
            duration = chrono::duration_cast<fms>(t1 - t0).count();
            std::cout << "2nd inference time: " << duration << " ms   \r" << std::flush;
            time = duration;
        }
        std::cout << "\navg: " << std::fixed << std::setprecision(3)
                  << std::accumulate(times.begin(), times.end(), 0.f, std::plus<float>()) /
                         times.size()
                  << " ms" << std::endl;
        std::cin.get();
        net.clean();
    }

    // Create some labels
    const std::vector<unsigned long> labels(mini_batch_size, 0);
    resnet::train_50 net;
    // measure backward pass
    std::vector<dlib::sgd> solvers(net.num_computational_layers, dlib::sgd(0.0005, 0.9));
    net.to_tensor(minibatch.begin(), minibatch.end(), x);
    net.compute_loss(x, labels.begin());
    net.back_propagate_error(x);
    net.update_parameters(solvers, 0.1);
    std::array<float, 100> times;
    for (auto& time : times)
    {
        t0 = chrono::steady_clock::now();
        net.to_tensor(minibatch.begin(), minibatch.end(), x);
        net.compute_loss(x, labels.begin());
        net.back_propagate_error(x);
        net.update_parameters(solvers, 0.1);
        t1 = chrono::steady_clock::now();
        duration = chrono::duration_cast<fms>(t1 - t0).count();
        std::cout << "backward pass time: " << duration << " ms   \r" << std::flush;
        time = duration;
    }
    std::cout << "\navg: " << std::fixed << std::setprecision(3)
              << std::accumulate(times.begin(), times.end(), 0.f, std::plus<float>()) /
                     times.size()
              << " ms" << std::endl;
    std::cin.get();

    return EXIT_SUCCESS;
}
catch (const std::exception& e)
{
    std::cout << e.what() << std::endl;
    return EXIT_FAILURE;
}